

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler_sse2.c
# Opt level: O2

void RescalerImportRowShrink_SSE2(WebPRescaler *wrk,uint8_t *src)

{
  uint uVar1;
  undefined7 uVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  unkbyte10 Var5;
  unkbyte10 Var6;
  int iVar7;
  long lVar8;
  rescaler_t *prVar9;
  ulong uVar10;
  rescaler_t *prVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  short sVar22;
  short sVar24;
  short sVar25;
  undefined1 auVar23 [16];
  ushort uVar26;
  byte bVar29;
  short sVar30;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined4 uVar34;
  short sVar35;
  undefined1 auVar33 [16];
  undefined4 uVar36;
  
  if ((wrk->num_channels == 4) && (uVar19 = wrk->x_sub, wrk->x_add <= (int)(uVar19 * 0x80))) {
    auVar20 = pshuflw(ZEXT416(uVar19),ZEXT416(uVar19),0);
    auVar21._0_4_ = auVar20._0_4_;
    auVar21._4_4_ = auVar21._0_4_;
    auVar21._8_4_ = auVar21._0_4_;
    auVar21._12_4_ = auVar21._0_4_;
    uVar1 = wrk->fx_scale;
    prVar9 = wrk->frow;
    prVar11 = prVar9 + (long)wrk->dst_width * 4;
    iVar13 = 0;
    auVar23 = (undefined1  [16])0x0;
    for (; prVar9 < prVar11; prVar9 = prVar9 + 4) {
      iVar13 = iVar13 + wrk->x_add;
      uVar15 = -iVar13;
      auVar27 = (undefined1  [16])0x0;
      while( true ) {
        sVar22 = auVar23._0_2_;
        sVar24 = auVar23._2_2_;
        sVar25 = auVar23._4_2_;
        sVar30 = auVar23._6_2_;
        if (iVar13 < 1) break;
        uVar34 = *(undefined4 *)src;
        src = src + 4;
        bVar29 = (byte)((uint)uVar34 >> 0x18);
        uVar2 = CONCAT25((short)(((uint7)bVar29 << 0x30) >> 0x28),
                         CONCAT14((char)((uint)uVar34 >> 0x10),uVar34));
        uVar26 = (ushort)uVar34;
        uVar10 = (ulong)CONCAT43((int)(CONCAT34((int3)((uint7)uVar2 >> 0x20),uVar34) >> 0x18),
                                 CONCAT12((char)((uint)uVar34 >> 8),uVar26)) & 0xffffffff00ffffff;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = CONCAT62((int6)(uVar10 >> 0x10),uVar26) & 0xffffffffffff00ff;
        auVar23._0_2_ = sVar22 + (uVar26 & 0xff);
        auVar23._2_2_ = sVar24 + (short)(uVar10 >> 0x10);
        auVar23._4_2_ = sVar25 + (short)((uint7)uVar2 >> 0x20);
        auVar23._6_2_ = sVar30 + (ushort)bVar29;
        iVar13 = iVar13 - uVar19;
        uVar15 = uVar15 + uVar19;
      }
      auVar31 = pshuflw(ZEXT416(uVar15),ZEXT416(uVar15),0);
      auVar32._0_4_ = auVar31._0_4_;
      auVar32._4_4_ = auVar32._0_4_;
      auVar32._8_4_ = auVar32._0_4_;
      auVar32._12_4_ = auVar32._0_4_;
      sVar35 = auVar31._2_2_ * auVar27._6_2_;
      auVar28 = pmulhuw(auVar27,auVar32);
      iVar12 = CONCAT22(auVar28._6_2_,sVar35);
      Var5 = CONCAT64(CONCAT42(iVar12,auVar28._4_2_),CONCAT22(auVar31._0_2_ * auVar27._4_2_,sVar35))
      ;
      uVar10 = (ulong)((unkuint10)Var5 >> 0x10);
      auVar3._4_8_ = uVar10;
      auVar3._2_2_ = auVar28._2_2_;
      auVar3._0_2_ = auVar31._2_2_ * auVar27._2_2_;
      auVar33._0_4_ = CONCAT22(auVar28._0_2_,auVar31._0_2_ * auVar27._0_2_);
      auVar33._4_12_ = auVar3;
      sVar30 = sVar30 * auVar20._2_2_;
      auVar27 = pmulhuw(auVar23,auVar21);
      iVar7 = CONCAT22(auVar27._6_2_,sVar30);
      Var6 = CONCAT64(CONCAT42(iVar7,auVar27._4_2_),CONCAT22(sVar25 * auVar20._0_2_,sVar30));
      auVar4._4_8_ = (long)((unkuint10)Var6 >> 0x10);
      auVar4._2_2_ = auVar27._2_2_;
      auVar4._0_2_ = sVar24 * auVar20._2_2_;
      uVar34 = (undefined4)((ulong)auVar33._0_4_ * (ulong)uVar1 + 0x80000000 >> 0x20);
      uVar36 = (undefined4)((uVar10 & 0xffffffff) * (ulong)uVar1 + 0x80000000 >> 0x20);
      auVar31._4_4_ = uVar36;
      auVar31._0_4_ = uVar34;
      auVar31._8_4_ = uVar36;
      auVar31._12_4_ = (int)((uVar10 >> 0x20) * (ulong)uVar1 + 0x80000000 >> 0x20);
      auVar28._8_8_ = auVar31._8_8_;
      auVar28._4_4_ = (int)((auVar33._0_8_ >> 0x20) * (ulong)uVar1 + 0x80000000 >> 0x20);
      auVar28._0_4_ = uVar34;
      auVar23 = packssdw(auVar28,(undefined1  [16])0x0);
      *prVar9 = CONCAT22(auVar27._0_2_,sVar22 * auVar20._0_2_) - auVar33._0_4_;
      prVar9[1] = auVar4._0_4_ - auVar3._0_4_;
      prVar9[2] = (int)((unkuint10)Var6 >> 0x10) - (int)((unkuint10)Var5 >> 0x10);
      prVar9[3] = iVar7 - iVar12;
    }
    return;
  }
  uVar19 = wrk->num_channels;
  lVar8 = (long)(int)uVar19;
  iVar13 = wrk->dst_width;
  uVar10 = 0;
  uVar14 = 0;
  if (0 < (int)uVar19) {
    uVar14 = (ulong)uVar19;
  }
  for (; uVar10 != uVar14; uVar10 = uVar10 + 1) {
    uVar17 = 0;
    iVar12 = 0;
    uVar18 = uVar10;
    for (uVar16 = uVar10; (long)uVar16 < iVar13 * lVar8; uVar16 = uVar16 + lVar8) {
      uVar18 = (ulong)(int)uVar18;
      uVar19 = 0;
      for (iVar12 = iVar12 + wrk->x_add; 0 < iVar12; iVar12 = iVar12 - wrk->x_sub) {
        uVar19 = (uint)src[uVar18];
        uVar17 = (ulong)((int)uVar17 + (uint)src[uVar18]);
        uVar18 = uVar18 + lVar8;
      }
      wrk->frow[uVar16] = (int)uVar17 * wrk->x_sub + uVar19 * iVar12;
      uVar17 = (ulong)wrk->fx_scale * (ulong)-(uVar19 * iVar12) + 0x80000000 >> 0x20;
    }
  }
  return;
}

Assistant:

static void RescalerImportRowShrink_SSE2(WebPRescaler* const wrk,
                                         const uint8_t* src) {
  const int x_sub = wrk->x_sub;
  int accum = 0;
  const __m128i zero = _mm_setzero_si128();
  const __m128i mult0 = _mm_set1_epi16(x_sub);
  const __m128i mult1 = _mm_set1_epi32(wrk->fx_scale);
  const __m128i rounder = _mm_set_epi32(0, ROUNDER, 0, ROUNDER);
  __m128i sum = zero;
  rescaler_t* frow = wrk->frow;
  const rescaler_t* const frow_end = wrk->frow + 4 * wrk->dst_width;

  if (wrk->num_channels != 4 || wrk->x_add > (x_sub << 7)) {
    WebPRescalerImportRowShrink_C(wrk, src);
    return;
  }
  assert(!WebPRescalerInputDone(wrk));
  assert(!wrk->x_expand);

  for (; frow < frow_end; frow += 4) {
    __m128i base = zero;
    accum += wrk->x_add;
    while (accum > 0) {
      const __m128i A = _mm_cvtsi32_si128(WebPMemToUint32(src));
      src += 4;
      base = _mm_unpacklo_epi8(A, zero);
      // To avoid overflow, we need: base * x_add / x_sub < 32768
      // => x_add < x_sub << 7. That's a 1/128 reduction ratio limit.
      sum = _mm_add_epi16(sum, base);
      accum -= x_sub;
    }
    {    // Emit next horizontal pixel.
      const __m128i mult = _mm_set1_epi16(-accum);
      const __m128i frac0 = _mm_mullo_epi16(base, mult);  // 16b x 16b -> 32b
      const __m128i frac1 = _mm_mulhi_epu16(base, mult);
      const __m128i frac = _mm_unpacklo_epi16(frac0, frac1);  // frac is 32b
      const __m128i A0 = _mm_mullo_epi16(sum, mult0);
      const __m128i A1 = _mm_mulhi_epu16(sum, mult0);
      const __m128i B0 = _mm_unpacklo_epi16(A0, A1);      // sum * x_sub
      const __m128i frow_out = _mm_sub_epi32(B0, frac);   // sum * x_sub - frac
      const __m128i D0 = _mm_srli_epi64(frac, 32);
      const __m128i D1 = _mm_mul_epu32(frac, mult1);      // 32b x 16b -> 64b
      const __m128i D2 = _mm_mul_epu32(D0, mult1);
      const __m128i E1 = _mm_add_epi64(D1, rounder);
      const __m128i E2 = _mm_add_epi64(D2, rounder);
      const __m128i F1 = _mm_shuffle_epi32(E1, 1 | (3 << 2));
      const __m128i F2 = _mm_shuffle_epi32(E2, 1 | (3 << 2));
      const __m128i G = _mm_unpacklo_epi32(F1, F2);
      sum = _mm_packs_epi32(G, zero);
      _mm_storeu_si128((__m128i*)frow, frow_out);
    }
  }
  assert(accum == 0);
}